

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_test.cpp
# Opt level: O0

void __thiscall Manifold_Warp_Test::TestBody(Manifold_Warp_Test *this)

{
  allocator<manifold::Manifold> *this_00;
  initializer_list<manifold::Manifold> __l;
  bool bVar1;
  char *pcVar2;
  double dVar3;
  double dVar4;
  Manifold *local_1d0;
  AssertHelper local_1b0;
  Message local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_2;
  Message local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_1;
  Message local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar;
  Manifold local_140 [16];
  iterator local_130;
  size_type local_128;
  vector<manifold::Manifold,_std::allocator<manifold::Manifold>_> local_120;
  vector local_108 [8];
  Manifold simplified;
  anon_class_1_0_00000001 local_f1;
  function<void_(linalg::vec<double,_3>_&)> local_f0;
  double local_d0;
  vec<double,_2> local_c8 [2];
  vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  local_a8;
  Manifold local_90 [16];
  Manifold local_80 [8];
  Manifold shape;
  double local_70;
  double local_68;
  vec<double,_2> local_60;
  CrossSection local_50 [8];
  CrossSection square;
  Manifold_Warp_Test *this_local;
  
  local_68 = 1.0;
  local_70 = 1.0;
  linalg::vec<double,_2>::vec(&local_60,&local_68,&local_70);
  manifold::CrossSection::Square(local_60.x,local_60.y,local_50,0);
  manifold::CrossSection::ToPolygons();
  local_d0 = 1.0;
  linalg::vec<double,_2>::vec(local_c8,&local_d0);
  manifold::Manifold::Extrude
            (0x4000000000000000,0,local_c8[0].x,local_c8[0].y,local_90,&local_a8,10);
  std::function<void(linalg::vec<double,3>&)>::function<Manifold_Warp_Test::TestBody()::__0,void>
            ((function<void(linalg::vec<double,3>&)> *)&local_f0,&local_f1);
  manifold::Manifold::Warp(local_80,local_90,&local_f0);
  std::function<void_(linalg::vec<double,_3>_&)>::~function(&local_f0);
  manifold::Manifold::~Manifold(local_90);
  std::
  vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  ::~vector(&local_a8);
  manifold::Manifold::Manifold(local_140,local_80);
  local_130 = local_140;
  local_128 = 1;
  this_00 = (allocator<manifold::Manifold> *)
            ((long)&gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 7);
  std::allocator<manifold::Manifold>::allocator(this_00);
  __l._M_len = local_128;
  __l._M_array = local_130;
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::vector
            (&local_120,__l,this_00);
  manifold::Manifold::Compose(local_108);
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::~vector(&local_120);
  std::allocator<manifold::Manifold>::~allocator
            ((allocator<manifold::Manifold> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_1d0 = (Manifold *)&local_130;
  do {
    local_1d0 = local_1d0 + -0x10;
    manifold::Manifold::~Manifold(local_1d0);
  } while (local_1d0 != local_140);
  dVar3 = (double)manifold::Manifold::Volume();
  dVar4 = (double)manifold::Manifold::Volume();
  testing::internal::DoubleNearPredFormat
            ((internal *)local_160,"shape.Volume()","simplified.Volume()","0.0001",dVar3,dVar4,
             0.0001);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x173,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  dVar3 = (double)manifold::Manifold::SurfaceArea();
  dVar4 = (double)manifold::Manifold::SurfaceArea();
  testing::internal::DoubleNearPredFormat
            ((internal *)local_180,"shape.SurfaceArea()","simplified.SurfaceArea()","0.0001",dVar3,
             dVar4,0.0001);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x174,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  dVar3 = (double)manifold::Manifold::Volume();
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1a0,"shape.Volume()","2","0.0001",dVar3,2.0,0.0001);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x175,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  manifold::Manifold::~Manifold((Manifold *)local_108);
  manifold::Manifold::~Manifold(local_80);
  manifold::CrossSection::~CrossSection(local_50);
  return;
}

Assistant:

TEST(Manifold, Warp) {
  CrossSection square = CrossSection::Square({1, 1});
  Manifold shape =
      Manifold::Extrude(square.ToPolygons(), 2, 10).Warp([](vec3& v) {
        v.x += v.z * v.z;
      });

  Manifold simplified = Manifold::Compose({shape});

  EXPECT_NEAR(shape.Volume(), simplified.Volume(), 0.0001);
  EXPECT_NEAR(shape.SurfaceArea(), simplified.SurfaceArea(), 0.0001);
  EXPECT_NEAR(shape.Volume(), 2, 0.0001);
}